

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::AMFImporter::Find_ConvertedNode
          (AMFImporter *this,string *pID,list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList,
          aiNode **pNode)

{
  aiNode *this_00;
  bool bVar1;
  char *__s;
  reference ppaVar2;
  aiNode *node;
  iterator __end1;
  iterator __begin1;
  list<aiNode_*,_std::allocator<aiNode_*>_> *__range1;
  allocator<char> local_459;
  string local_458;
  undefined1 local_434 [8];
  aiString node_name;
  aiNode **pNode_local;
  list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList_local;
  string *pID_local;
  AMFImporter *this_local;
  
  node_name.data._1016_8_ = pNode;
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,__s,&local_459);
  aiString::aiString((aiString *)local_434,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  __end1 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin(pNodeList);
  node = (aiNode *)std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end(pNodeList);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&node);
    if (!bVar1) {
      return false;
    }
    ppaVar2 = std::_List_iterator<aiNode_*>::operator*(&__end1);
    this_00 = *ppaVar2;
    bVar1 = aiString::operator==(&this_00->mName,(aiString *)local_434);
    if (bVar1) break;
    std::_List_iterator<aiNode_*>::operator++(&__end1);
  }
  if (node_name.data._1016_8_ != 0) {
    *(aiNode **)node_name.data._1016_8_ = this_00;
  }
  return true;
}

Assistant:

bool AMFImporter::Find_ConvertedNode(const std::string& pID, std::list<aiNode*>& pNodeList, aiNode** pNode) const
{
aiString node_name(pID.c_str());

	for(aiNode* node: pNodeList)
	{
		if(node->mName == node_name)
		{
			if(pNode != nullptr) *pNode = node;

			return true;
		}
	}// for(aiNode* node: pNodeList)

	return false;
}